

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O1

int ldhexchange(lua_State *L)

{
  int iVar1;
  uint64_t *puVar2;
  uint64_t r;
  size_t sz;
  size_t local_20;
  
  local_20 = 0;
  puVar2 = (uint64_t *)luaL_checklstring(L,1,&local_20);
  if (local_20 != 8) {
    luaL_error(L,"Invalid dh uint64 key");
  }
  if (*puVar2 == 0) {
    iVar1 = luaL_error(L,"Can\'t be 0");
  }
  else {
    r = pow_mod_p(5,*puVar2);
    push64(L,r);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
ldhexchange(lua_State *L) {
	size_t sz = 0;
	const uint8_t *x = (const uint8_t *)luaL_checklstring(L, 1, &sz);
	if (sz != 8) {
		luaL_error(L, "Invalid dh uint64 key");
	}
	uint32_t xx[2];
	xx[0] = x[0] | x[1]<<8 | x[2]<<16 | x[3]<<24;
	xx[1] = x[4] | x[5]<<8 | x[6]<<16 | x[7]<<24;

	uint64_t x64 = (uint64_t)xx[0] | (uint64_t)xx[1]<<32;
	if (x64 == 0)
		return luaL_error(L, "Can't be 0");

	uint64_t r = powmodp(5,	x64);
	push64(L, r);
	return 1;
}